

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32_t tag,CodedOutputStream *output)

{
  int iVar1;
  undefined4 uVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int64_t iVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  ulong uVar13;
  uint32_t first_byte_or_zero;
  ulong uVar14;
  byte bVar15;
  uint8_t *puVar16;
  size_t __n;
  pair<unsigned_long,_bool> pVar17;
  string temp;
  string local_50;
  
  if (tag < 8) goto LAB_0039ff2d;
  bVar5 = 0;
  bVar15 = (byte)tag;
  switch(tag & 7) {
  case 0:
    puVar16 = input->buffer_;
    if ((puVar16 < input->buffer_end_) && (uVar14 = (ulong)(char)*puVar16, -1 < (long)uVar14)) {
      input->buffer_ = puVar16 + 1;
      uVar10 = 1;
    }
    else {
      pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar14 = pVar17.first;
      uVar10 = pVar17._8_4_;
    }
    bVar5 = (byte)uVar10;
    if ((uVar10 & 1) != 0) {
      pbVar9 = output->cur_;
      if ((output->impl_).end_ <= pbVar9) {
        pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
      }
      output->cur_ = pbVar9;
      *pbVar9 = bVar15;
      if (tag < 0x80) {
        pbVar12 = pbVar9 + 1;
      }
      else {
        *pbVar9 = bVar15 | 0x80;
        pbVar9[1] = (byte)(tag >> 7);
        pbVar12 = pbVar9 + 2;
        if (0x3fff < tag) {
          uVar11 = (uint)pbVar9[1];
          uVar10 = tag >> 7;
          do {
            pbVar12[-1] = (byte)uVar11 | 0x80;
            uVar11 = uVar10 >> 7;
            *pbVar12 = (byte)uVar11;
            pbVar12 = pbVar12 + 1;
            bVar4 = 0x3fff < uVar10;
            uVar10 = uVar11;
          } while (bVar4);
        }
      }
      output->cur_ = pbVar12;
      if ((output->impl_).end_ <= pbVar12) {
        pbVar12 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar12);
      }
      output->cur_ = pbVar12;
      *pbVar12 = (byte)uVar14;
      if (uVar14 < 0x80) {
        pbVar9 = pbVar12 + 1;
      }
      else {
        *pbVar12 = (byte)uVar14 | 0x80;
        pbVar12[1] = (byte)(uVar14 >> 7);
        pbVar9 = pbVar12 + 2;
        if (0x3fff < uVar14) {
          uVar13 = (ulong)pbVar12[1];
          uVar14 = uVar14 >> 7;
          do {
            pbVar9[-1] = (byte)uVar13 | 0x80;
            uVar7 = uVar14 >> 7;
            *pbVar9 = (byte)uVar7;
            pbVar9 = pbVar9 + 1;
            uVar13 = uVar7 & 0xffffffff;
            bVar4 = 0x3fff < uVar14;
            uVar14 = uVar7;
          } while (bVar4);
        }
      }
      output->cur_ = pbVar9;
    }
    goto switchD_0039ff67_caseD_4;
  case 1:
    puVar16 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar16 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_50);
    }
    else {
      local_50._M_dataplus._M_p = *(pointer *)puVar16;
      input->buffer_ = puVar16 + 8;
      bVar5 = true;
    }
    if ((bool)bVar5 == false) goto switchD_0039ff67_caseD_4;
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    _Var3._M_p = local_50._M_dataplus._M_p;
    output->cur_ = pbVar9;
    *pbVar9 = bVar15;
    if (tag < 0x80) {
      pbVar12 = pbVar9 + 1;
    }
    else {
      *pbVar9 = bVar15 | 0x80;
      pbVar9[1] = (byte)(tag >> 7);
      pbVar12 = pbVar9 + 2;
      if (0x3fff < tag) {
        uVar11 = (uint)pbVar9[1];
        uVar10 = tag >> 7;
        do {
          pbVar12[-1] = (byte)uVar11 | 0x80;
          uVar11 = uVar10 >> 7;
          *pbVar12 = (byte)uVar11;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar4);
      }
    }
    output->cur_ = pbVar12;
    if ((output->impl_).end_ <= pbVar12) {
      pbVar12 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar12);
    }
    output->cur_ = pbVar12;
    *(pointer *)pbVar12 = _Var3._M_p;
    pbVar12 = pbVar12 + 8;
    break;
  case 2:
    pbVar9 = input->buffer_;
    if (pbVar9 < input->buffer_end_) {
      bVar5 = *pbVar9;
      first_byte_or_zero = (uint32_t)bVar5;
      uVar10 = (uint)bVar5;
      if ((char)bVar5 < '\0') goto LAB_003a02c4;
      input->buffer_ = pbVar9 + 1;
      bVar4 = true;
    }
    else {
      first_byte_or_zero = 0;
LAB_003a02c4:
      iVar8 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      uVar10 = (uint)iVar8;
      bVar4 = -1 < iVar8;
    }
    if (bVar4) {
      pbVar9 = output->cur_;
      if ((output->impl_).end_ <= pbVar9) {
        pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
      }
      output->cur_ = pbVar9;
      *pbVar9 = bVar15;
      if (tag < 0x80) {
        pbVar12 = pbVar9 + 1;
      }
      else {
        *pbVar9 = bVar15 | 0x80;
        pbVar9[1] = (byte)(tag >> 7);
        pbVar12 = pbVar9 + 2;
        if (0x3fff < tag) {
          uVar6 = (uint)pbVar9[1];
          uVar11 = tag >> 7;
          do {
            pbVar12[-1] = (byte)uVar6 | 0x80;
            uVar6 = uVar11 >> 7;
            *pbVar12 = (byte)uVar6;
            pbVar12 = pbVar12 + 1;
            bVar4 = 0x3fff < uVar11;
            uVar11 = uVar6;
          } while (bVar4);
        }
      }
      output->cur_ = pbVar12;
      if ((output->impl_).end_ <= pbVar12) {
        pbVar12 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar12);
      }
      output->cur_ = pbVar12;
      *pbVar12 = (byte)uVar10;
      if (uVar10 < 0x80) {
        pbVar9 = pbVar12 + 1;
      }
      else {
        *pbVar12 = (byte)uVar10 | 0x80;
        pbVar12[1] = (byte)(uVar10 >> 7);
        pbVar9 = pbVar12 + 2;
        if (0x3fff < uVar10) {
          uVar6 = (uint)pbVar12[1];
          uVar11 = uVar10 >> 7;
          do {
            pbVar9[-1] = (byte)uVar6 | 0x80;
            uVar6 = uVar11 >> 7;
            *pbVar9 = (byte)uVar6;
            pbVar9 = pbVar9 + 1;
            bVar4 = 0x3fff < uVar11;
            uVar11 = uVar6;
          } while (bVar4);
        }
      }
      output->cur_ = pbVar9;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      bVar5 = io::CodedInputStream::ReadString(input,&local_50,uVar10);
      if ((bool)bVar5) {
        puVar16 = output->cur_;
        __n = (size_t)(int)local_50._M_string_length;
        if ((long)(output->impl_).end_ - (long)puVar16 < (long)__n) {
          puVar16 = io::EpsCopyOutputStream::WriteRawFallback
                              (&output->impl_,local_50._M_dataplus._M_p,
                               (int)local_50._M_string_length,puVar16);
        }
        else {
          memcpy(puVar16,local_50._M_dataplus._M_p,__n);
          puVar16 = puVar16 + __n;
        }
        output->cur_ = puVar16;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      goto switchD_0039ff67_caseD_4;
    }
    goto LAB_0039ff2d;
  case 3:
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    *pbVar9 = bVar15;
    if (tag < 0x80) {
      pbVar12 = pbVar9 + 1;
    }
    else {
      *pbVar9 = bVar15 | 0x80;
      pbVar9[1] = (byte)(tag >> 7);
      pbVar12 = pbVar9 + 2;
      if (0x3fff < tag) {
        uVar11 = (uint)pbVar9[1];
        uVar10 = tag >> 7;
        do {
          pbVar12[-1] = (byte)uVar11 | 0x80;
          uVar11 = uVar10 >> 7;
          *pbVar12 = (byte)uVar11;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar4);
      }
    }
    output->cur_ = pbVar12;
    iVar1 = input->recursion_budget_;
    input->recursion_budget_ = iVar1 + -1;
    if ((0 < iVar1) && (bVar4 = SkipMessage(input,output), bVar4)) {
      if (input->recursion_budget_ < input->recursion_limit_) {
        input->recursion_budget_ = input->recursion_budget_ + 1;
      }
      bVar5 = input->last_tag_ == (tag & 0xfffffff8 | 4);
      goto switchD_0039ff67_caseD_4;
    }
LAB_0039ff2d:
    bVar5 = 0;
  default:
    goto switchD_0039ff67_caseD_4;
  case 5:
    puVar16 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar16 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_50);
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar16;
      input->buffer_ = puVar16 + 4;
      bVar5 = true;
    }
    if ((bool)bVar5 == false) goto switchD_0039ff67_caseD_4;
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    *pbVar9 = bVar15;
    if (tag < 0x80) {
      pbVar12 = pbVar9 + 1;
    }
    else {
      *pbVar9 = bVar15 | 0x80;
      pbVar9[1] = (byte)(tag >> 7);
      pbVar12 = pbVar9 + 2;
      if (0x3fff < tag) {
        uVar11 = (uint)pbVar9[1];
        uVar10 = tag >> 7;
        do {
          pbVar12[-1] = (byte)uVar11 | 0x80;
          uVar11 = uVar10 >> 7;
          *pbVar12 = (byte)uVar11;
          pbVar12 = pbVar12 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar4);
      }
    }
    output->cur_ = pbVar12;
    uVar2 = local_50._M_dataplus._M_p._0_4_;
    if ((output->impl_).end_ <= pbVar12) {
      pbVar12 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar12);
    }
    output->cur_ = pbVar12;
    *(undefined4 *)pbVar12 = uVar2;
    pbVar12 = pbVar12 + 4;
  }
  output->cur_ = pbVar12;
switchD_0039ff67_caseD_4:
  return (bool)(bVar5 & 1);
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32_t tag,
                               io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      std::string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}